

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genx.c
# Opt level: O0

genxStatus genxStartDocSender(genxWriter w,genxSender *sender)

{
  genxSender *sender_local;
  genxWriter w_local;
  genxStatus local_4;
  
  if (w->sequence == SEQUENCE_NO_DOC) {
    w->sequence = SEQUENCE_PRE_DOC;
    w->file = (FILE *)0x0;
    w->sender = sender;
    local_4 = GENX_SUCCESS;
  }
  else {
    w->status = GENX_SEQUENCE_ERROR;
    local_4 = GENX_SEQUENCE_ERROR;
  }
  return local_4;
}

Assistant:

genxStatus genxStartDocSender(genxWriter w, genxSender * sender)
{
  if (w->sequence != SEQUENCE_NO_DOC)
    return w->status = GENX_SEQUENCE_ERROR;
  
  w->sequence = SEQUENCE_PRE_DOC;
  w->file = NULL;
  w->sender = sender;
  return GENX_SUCCESS;
}